

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int recv_with_timeout(amqp_connection_state_t state,amqp_time_t timeout)

{
  int iVar1;
  amqp_connection_state_t paVar2;
  amqp_time_t in_RDI;
  int fd;
  ssize_t res;
  undefined8 in_stack_ffffffffffffffc8;
  amqp_connection_state_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  amqp_socket_t *in_stack_ffffffffffffffe0;
  int fd_00;
  int local_4;
  
  while( true ) {
    paVar2 = (amqp_connection_state_t)
             amqp_socket_recv(in_stack_ffffffffffffffe0,
                              (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (size_t)in_stack_ffffffffffffffd0,
                              (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    if (-1 < (long)paVar2) {
      ((amqp_connection_state_t)in_RDI.time_point_ns)->sock_inbound_limit = (size_t)paVar2;
      ((amqp_connection_state_t)in_RDI.time_point_ns)->sock_inbound_offset = 0;
      amqp_heartbeat_recv((amqp_connection_state_t)in_RDI.time_point_ns);
      local_4 = amqp_time_s_from_now
                          ((amqp_time_t *)in_RDI.time_point_ns,(int)((ulong)paVar2 >> 0x20));
      if (local_4 == 0) {
        local_4 = 0;
      }
      return local_4;
    }
    in_stack_ffffffffffffffdc = amqp_get_sockfd(in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = paVar2;
    if (in_stack_ffffffffffffffdc == -1) {
      return -7;
    }
    iVar1 = (int)in_stack_ffffffffffffffd0;
    fd_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    if (in_stack_ffffffffffffffd0 == (amqp_connection_state_t)0xffffffffffffecfe) {
      iVar1 = amqp_poll(fd_00,iVar1,in_RDI);
    }
    else {
      if (in_stack_ffffffffffffffd0 != (amqp_connection_state_t)0xffffffffffffecff) {
        return iVar1;
      }
      iVar1 = amqp_poll(fd_00,iVar1,in_RDI);
    }
    if (iVar1 != 0) break;
    in_stack_ffffffffffffffe0 = (amqp_socket_t *)0x0;
  }
  return iVar1;
}

Assistant:

static int recv_with_timeout(amqp_connection_state_t state,
                             amqp_time_t timeout) {
  ssize_t res;
  int fd;

start_recv:
  res = amqp_socket_recv(state->socket, state->sock_inbound_buffer.bytes,
                         state->sock_inbound_buffer.len, 0);

  if (res < 0) {
    fd = amqp_get_sockfd(state);
    if (-1 == fd) {
      return AMQP_STATUS_CONNECTION_CLOSED;
    }
    switch (res) {
      default:
        return (int)res;
      case AMQP_PRIVATE_STATUS_SOCKET_NEEDREAD:
        res = amqp_poll(fd, AMQP_SF_POLLIN, timeout);
        break;
      case AMQP_PRIVATE_STATUS_SOCKET_NEEDWRITE:
        res = amqp_poll(fd, AMQP_SF_POLLOUT, timeout);
        break;
    }
    if (AMQP_STATUS_OK == res) {
      goto start_recv;
    }
    return (int)res;
  }

  state->sock_inbound_limit = res;
  state->sock_inbound_offset = 0;

  res = amqp_time_s_from_now(&state->next_recv_heartbeat,
                             amqp_heartbeat_recv(state));
  if (AMQP_STATUS_OK != res) {
    return (int)res;
  }
  return AMQP_STATUS_OK;
}